

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::Compilation::getGlobalClockingAndNoteUse(Compilation *this,Scope *scope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  Symbol *pSVar5;
  int iVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  ulong uVar9;
  long lVar10;
  Scope *pSVar11;
  HierarchicalReference *ref;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  
  sVar15 = 0;
  pSVar11 = scope;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pSVar11;
    uVar12 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar12 >> ((byte)(this->globalClockingMap).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
                             .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar12 & 0xff];
    ppVar3 = (this->globalClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.elements_;
    uVar4 = (this->globalClockingMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
            .arrays.groups_size_mask;
    uVar14 = 0;
    do {
      pgVar1 = (this->globalClockingMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_ + uVar9;
      bVar8 = pgVar1->m[0xf].n;
      uVar16 = (uchar)uVar2;
      auVar20[0] = -(pgVar1->m[0].n == uVar16);
      uVar17 = (uchar)((uint)uVar2 >> 8);
      auVar20[1] = -(pgVar1->m[1].n == uVar17);
      uVar18 = (uchar)((uint)uVar2 >> 0x10);
      auVar20[2] = -(pgVar1->m[2].n == uVar18);
      bVar19 = (byte)((uint)uVar2 >> 0x18);
      auVar20[3] = -(pgVar1->m[3].n == bVar19);
      auVar20[4] = -(pgVar1->m[4].n == uVar16);
      auVar20[5] = -(pgVar1->m[5].n == uVar17);
      auVar20[6] = -(pgVar1->m[6].n == uVar18);
      auVar20[7] = -(pgVar1->m[7].n == bVar19);
      auVar20[8] = -(pgVar1->m[8].n == uVar16);
      auVar20[9] = -(pgVar1->m[9].n == uVar17);
      auVar20[10] = -(pgVar1->m[10].n == uVar18);
      auVar20[0xb] = -(pgVar1->m[0xb].n == bVar19);
      auVar20[0xc] = -(pgVar1->m[0xc].n == uVar16);
      auVar20[0xd] = -(pgVar1->m[0xd].n == uVar17);
      auVar20[0xe] = -(pgVar1->m[0xe].n == uVar18);
      auVar20[0xf] = -(bVar8 == bVar19);
      for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
          uVar13 = uVar13 - 1 & uVar13) {
        iVar6 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (pSVar11 == *(Scope **)((long)&ppVar3[uVar9 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
          pSVar5 = *(Symbol **)((long)&ppVar3[uVar9 * 0xf].second + (ulong)(uint)(iVar6 << 4));
          if (sVar15 == 0) {
            return pSVar5;
          }
          ref = BumpAllocator::emplace<slang::ast::HierarchicalReference>
                          (&this->super_BumpAllocator);
          ref->target = pSVar5;
          ref->upwardCount = sVar15;
          noteUpwardReference(this,scope,ref);
          return pSVar5;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar8) == 0) break;
      lVar10 = uVar9 + uVar14;
      uVar14 = uVar14 + 1;
      uVar9 = lVar10 + 1U & uVar4;
    } while (uVar14 <= uVar4);
    pSVar11 = Symbol::getHierarchicalParent(pSVar11->thisSym);
    sVar15 = sVar15 + 1;
    if (pSVar11 == (Scope *)0x0) {
      return (Symbol *)0x0;
    }
  } while( true );
}

Assistant:

const Symbol* Compilation::getGlobalClockingAndNoteUse(const Scope& scope) {
    SLANG_ASSERT(!isFrozen());

    size_t upwardCount = 0;
    auto curr = &scope;
    do {
        if (auto it = globalClockingMap.find(curr); it != globalClockingMap.end()) {
            auto found = it->second;
            if (upwardCount > 0) {
                auto ref = emplace<HierarchicalReference>();
                ref->target = found;
                ref->upwardCount = upwardCount;
                noteUpwardReference(scope, *ref);
            }

            return found;
        }

        curr = curr->asSymbol().getHierarchicalParent();
        upwardCount++;
    } while (curr);

    return nullptr;
}